

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bossac.cpp
# Opt level: O0

void __thiscall BossaObserver::onProgress(BossaObserver *this,int num,int div)

{
  undefined4 in_register_00000034;
  int local_20;
  int local_1c;
  int bars;
  int ticks;
  int div_local;
  int num_local;
  BossaObserver *this_local;
  
  local_20 = 0x1e;
  local_1c = (num * 0x1e) / div;
  if (local_1c != this->_lastTicks) {
    printf("\r[",CONCAT44(in_register_00000034,num),(long)(num * 0x1e) % (long)div & 0xffffffff);
    while (0 < local_1c) {
      putchar(0x3d);
      local_20 = local_20 + -1;
      local_1c = local_1c + -1;
    }
    while (0 < local_20) {
      putchar(0x20);
      local_20 = local_20 + -1;
    }
    printf("] %d%% (%d/%d pages)",(long)(num * 100) / (long)div & 0xffffffff,(ulong)(uint)num,
           (ulong)(uint)div);
    fflush(_stdout);
    this->_lastTicks = 0;
  }
  return;
}

Assistant:

void
BossaObserver::onProgress(int num, int div)
{
    int ticks;
    int bars = 30;

    ticks = num * bars / div;
    
    if (ticks == _lastTicks)
        return;
    
    printf("\r[");
    while (ticks-- > 0)
    {
        putchar('=');
        bars--;
    }
    while (bars-- > 0)
    {
        putchar(' ');
    }
    printf("] %d%% (%d/%d pages)", num * 100 / div, num, div);
    fflush(stdout);
    
    _lastTicks = 0;
}